

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

void P_SpawnSkybox(ASkyViewpoint *origin)

{
  line_t_conflict *plVar1;
  uint pnum;
  subsector_t *psVar2;
  sector_t_conflict *psVar3;
  line_t_conflict **pplVar4;
  long lVar5;
  
  psVar3 = (sector_t_conflict *)(origin->super_AActor).Sector;
  if (psVar3 == (sector_t_conflict *)0x0) {
    Printf("Sector not initialized for SkyCamCompat\n");
    psVar2 = P_PointInSubsector((origin->super_AActor).__Pos.X,(origin->super_AActor).__Pos.Y);
    psVar3 = psVar2->sector;
    (origin->super_AActor).Sector = (sector_t *)psVar3;
    if (psVar3 == (sector_t_conflict *)0x0) {
      return;
    }
  }
  if (0 < (long)psVar3->linecount) {
    pplVar4 = psVar3->lines;
    lVar5 = 0;
    do {
      plVar1 = pplVar4[lVar5];
      if ((plVar1->special == 0x39) && (plVar1->args[1] == 2)) {
        pnum = P_GetSkyboxPortal(origin);
        CopyPortal(plVar1->args[0],plVar1->args[2],pnum,0.0,SUB81(pplVar4,0));
        return;
      }
      lVar5 = lVar5 + 1;
    } while (psVar3->linecount != lVar5);
  }
  return;
}

Assistant:

void P_SpawnSkybox(ASkyViewpoint *origin)
{
	sector_t *Sector = origin->Sector;
	if (Sector == NULL)
	{
		Printf("Sector not initialized for SkyCamCompat\n");
		origin->Sector = Sector = P_PointInSector(origin->Pos());
	}
	if (Sector)
	{
		line_t * refline = NULL;
		for (short i = 0; i < Sector->linecount; i++)
		{
			refline = Sector->lines[i];
			if (refline->special == Sector_SetPortal && refline->args[1] == 2)
			{
				// We found the setup linedef for this skybox, so let's use it for our init.
				unsigned pnum = P_GetSkyboxPortal(origin);
				CopyPortal(refline->args[0], refline->args[2], pnum, 0, true);
				return;
			}
		}
	}
}